

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void PickBestIntra16(VP8EncIterator *it,VP8ModeScore *rd)

{
  int lambda_00;
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  long lVar4;
  uint32_t uVar5;
  int iVar6;
  VP8SegmentInfo *dqm_00;
  VP8EncIterator *in_RSI;
  long in_RDI;
  uint8_t *tmp_dst;
  int is_flat;
  int mode;
  VP8ModeScore *rd_best;
  VP8ModeScore *rd_cur;
  VP8ModeScore rd_tmp;
  uint8_t *src;
  int tlambda;
  int lambda;
  VP8SegmentInfo *dqm;
  int kNumBlocks;
  int local_3c4;
  int local_3b8;
  int mode_00;
  VP8EncIterator *it_00;
  VP8ModeScore *local_3a8 [4];
  VP8ModeScore *in_stack_fffffffffffffc78;
  VP8EncIterator *in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffe9c;
  uint8_t *in_stack_fffffffffffffea0;
  VP8ModeScore *in_stack_fffffffffffffea8;
  VP8EncIterator *in_stack_fffffffffffffeb0;
  
  dqm_00 = (VP8SegmentInfo *)
           (*(long *)(in_RDI + 0x28) + 0x260 + (ulong)(**(byte **)(in_RDI + 0x30) >> 5 & 3) * 0x2e8)
  ;
  lambda_00 = dqm_00->lambda_i16;
  iVar1 = dqm_00->tlambda;
  puVar2 = *(uint8_t **)(in_RDI + 8);
  local_3a8[0] = (VP8ModeScore *)(local_3a8 + 1);
  it_00 = in_RSI;
  local_3b8 = IsFlatSource16(*(uint8_t **)(in_RDI + 8));
  *(int *)(in_RSI->yuv_mem + 0x160) = -1;
  for (mode_00 = 0; mode_00 < 4; mode_00 = mode_00 + 1) {
    puVar3 = *(uint8_t **)(in_RDI + 0x18);
    local_3a8[0]->mode_i16 = mode_00;
    uVar5 = ReconstructIntra16(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    local_3a8[0]->nz = uVar5;
    iVar6 = (*VP8SSE16x16)(puVar2,puVar3);
    local_3a8[0]->D = (score_t)(long)iVar6;
    if (iVar1 == 0) {
      local_3c4 = 0;
    }
    else {
      iVar6 = (*VP8TDisto16x16)(puVar2,puVar3,kWeightY);
      local_3c4 = iVar1 * iVar6 + 0x80 >> 8;
    }
    local_3a8[0]->SD = (long)local_3c4;
    local_3a8[0]->H = (ulong)VP8FixedCostsI16[mode_00];
    iVar6 = VP8GetCostLuma16(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    local_3a8[0]->R = (long)iVar6;
    if ((local_3b8 != 0) &&
       (local_3b8 = IsFlat_C(local_3a8[0]->y_ac_levels[0],0x10,0), local_3b8 != 0)) {
      local_3a8[0]->D = (score_t)((long)local_3a8[0]->D << 1);
      local_3a8[0]->SD = local_3a8[0]->SD << 1;
    }
    SetRDScore(lambda_00,local_3a8[0]);
    if ((mode_00 == 0) || (local_3a8[0]->score < (long)it_00->yuv_p)) {
      SwapModeScore(local_3a8,(VP8ModeScore **)&stack0xfffffffffffffc50);
      SwapOut((VP8EncIterator *)0x17df64);
    }
  }
  if (it_00 != in_RSI) {
    memcpy(in_RSI,it_00,0x370);
  }
  SetRDScore(dqm_00->lambda_mode,(VP8ModeScore *)in_RSI);
  VP8SetIntra16Mode(it_00,mode_00);
  if (((*(uint *)(in_RSI->yuv_mem + 0x178) & 0x100ffff) == 0x1000000) &&
     (lVar4._0_4_ = in_RSI->x, lVar4._4_4_ = in_RSI->y, dqm_00->min_disto < lVar4)) {
    StoreMaxDelta(dqm_00,(int16_t *)&in_RSI->enc);
  }
  return;
}

Assistant:

static void PickBestIntra16(VP8EncIterator* WEBP_RESTRICT const it,
                            VP8ModeScore* WEBP_RESTRICT rd) {
  const int kNumBlocks = 16;
  VP8SegmentInfo* const dqm = &it->enc->dqm[it->mb->segment];
  const int lambda = dqm->lambda_i16;
  const int tlambda = dqm->tlambda;
  const uint8_t* const src = it->yuv_in + Y_OFF_ENC;
  VP8ModeScore rd_tmp;
  VP8ModeScore* rd_cur = &rd_tmp;
  VP8ModeScore* rd_best = rd;
  int mode;
  int is_flat = IsFlatSource16(it->yuv_in + Y_OFF_ENC);

  rd->mode_i16 = -1;
  for (mode = 0; mode < NUM_PRED_MODES; ++mode) {
    uint8_t* const tmp_dst = it->yuv_out2 + Y_OFF_ENC;  // scratch buffer
    rd_cur->mode_i16 = mode;

    // Reconstruct
    rd_cur->nz = ReconstructIntra16(it, rd_cur, tmp_dst, mode);

    // Measure RD-score
    rd_cur->D = VP8SSE16x16(src, tmp_dst);
    rd_cur->SD =
        tlambda ? MULT_8B(tlambda, VP8TDisto16x16(src, tmp_dst, kWeightY)) : 0;
    rd_cur->H = VP8FixedCostsI16[mode];
    rd_cur->R = VP8GetCostLuma16(it, rd_cur);
    if (is_flat) {
      // refine the first impression (which was in pixel space)
      is_flat = IsFlat(rd_cur->y_ac_levels[0], kNumBlocks, FLATNESS_LIMIT_I16);
      if (is_flat) {
        // Block is very flat. We put emphasis on the distortion being very low!
        rd_cur->D *= 2;
        rd_cur->SD *= 2;
      }
    }

    // Since we always examine Intra16 first, we can overwrite *rd directly.
    SetRDScore(lambda, rd_cur);
    if (mode == 0 || rd_cur->score < rd_best->score) {
      SwapModeScore(&rd_cur, &rd_best);
      SwapOut(it);
    }
  }
  if (rd_best != rd) {
    memcpy(rd, rd_best, sizeof(*rd));
  }
  SetRDScore(dqm->lambda_mode, rd);   // finalize score for mode decision.
  VP8SetIntra16Mode(it, rd->mode_i16);

  // we have a blocky macroblock (only DCs are non-zero) with fairly high
  // distortion, record max delta so we can later adjust the minimal filtering
  // strength needed to smooth these blocks out.
  if ((rd->nz & 0x100ffff) == 0x1000000 && rd->D > dqm->min_disto) {
    StoreMaxDelta(dqm, rd->y_dc_levels);
  }
}